

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int ctl_lookup(tsdn_t *tsdn,ctl_named_node_t *starting_node,char *name,
              ctl_named_node_t **ending_nodep,size_t *mibp,size_t *depthp)

{
  char *__s;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ctl_node_t *pcVar5;
  uintmax_t uVar6;
  ctl_named_node_t *pcVar7;
  ctl_named_node_t *pcVar8;
  long lVar9;
  size_t sVar10;
  ulong local_78;
  size_t local_60;
  
  pcVar3 = strchr(name,0x2e);
  if (pcVar3 == (char *)0x0) {
    sVar4 = strlen(name);
    pcVar3 = name + sVar4;
  }
  local_60 = (long)pcVar3 - (long)name;
  if (local_60 == 0) {
LAB_01180594:
    iVar2 = 2;
  }
  else {
    if (*depthp != 0) {
      local_78 = 0;
      pcVar8 = starting_node;
      do {
        starting_node = pcVar8;
        if (pcVar8->children->named == true) {
          if (pcVar8->nchildren != 0) {
            lVar9 = 0;
            sVar10 = 0;
            do {
              pcVar5 = starting_node->children;
              if (pcVar5->named == false) {
                pcVar5 = (ctl_node_t *)0x0;
              }
              pcVar7 = (ctl_named_node_t *)(pcVar5 + lVar9);
              if (pcVar5 == (ctl_node_t *)0x0) {
                pcVar7 = (ctl_named_node_t *)0x0;
              }
              __s = pcVar7->name;
              sVar4 = strlen(__s);
              bVar1 = true;
              if ((sVar4 == local_60) && (iVar2 = strncmp(name,__s,local_60), iVar2 == 0)) {
                mibp[local_78] = sVar10;
                bVar1 = false;
                starting_node = pcVar7;
              }
              if (!bVar1) break;
              sVar10 = sVar10 + 1;
              lVar9 = lVar9 + 0x28;
            } while (sVar10 < starting_node->nchildren);
          }
          if (starting_node == pcVar8) goto LAB_01180594;
        }
        else {
          bVar1 = false;
          uVar6 = duckdb_je_malloc_strtoumax(name,(char **)0x0,10);
          if (uVar6 != 0xffffffffffffffff) {
            starting_node = (ctl_named_node_t *)0x0;
            pcVar7 = (ctl_named_node_t *)pcVar8->children;
            if ((((ctl_named_node_t *)pcVar8->children)->node).named != false) {
              pcVar7 = starting_node;
            }
            pcVar8 = (ctl_named_node_t *)(*(code *)pcVar7->name)(tsdn,mibp,*depthp,uVar6);
            if (pcVar8 == (ctl_named_node_t *)0x0) {
              bVar1 = false;
            }
            else {
              mibp[local_78] = uVar6;
              bVar1 = true;
              starting_node = pcVar8;
            }
          }
          if (!bVar1) goto LAB_01180594;
        }
        if ((starting_node->ctl !=
             (_func_int_tsd_t_ptr_size_t_ptr_size_t_void_ptr_size_t_ptr_void_ptr_size_t *)0x0) ||
           (*pcVar3 == '\0')) {
          if (*pcVar3 != '\0') {
            return 2;
          }
          *depthp = local_78 + 1;
          break;
        }
        name = pcVar3 + 1;
        pcVar3 = strchr(name,0x2e);
        if (pcVar3 == (char *)0x0) {
          sVar4 = strlen(name);
          pcVar3 = name + sVar4;
        }
        local_60 = (long)pcVar3 - (long)name;
        local_78 = local_78 + 1;
        pcVar8 = starting_node;
      } while (local_78 < *depthp);
    }
    iVar2 = 0;
    if (ending_nodep != (ctl_named_node_t **)0x0) {
      *ending_nodep = starting_node;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int
ctl_lookup(tsdn_t *tsdn, const ctl_named_node_t *starting_node,
    const char *name, const ctl_named_node_t **ending_nodep, size_t *mibp,
    size_t *depthp) {
	int ret;
	const char *elm, *tdot, *dot;
	size_t elen, i, j;
	const ctl_named_node_t *node;

	elm = name;
	/* Equivalent to strchrnul(). */
	dot = ((tdot = strchr(elm, '.')) != NULL) ? tdot : strchr(elm, '\0');
	elen = (size_t)((uintptr_t)dot - (uintptr_t)elm);
	if (elen == 0) {
		ret = ENOENT;
		goto label_return;
	}
	node = starting_node;
	for (i = 0; i < *depthp; i++) {
		assert(node);
		assert(node->nchildren > 0);
		if (ctl_named_node(node->children) != NULL) {
			const ctl_named_node_t *pnode = node;

			/* Children are named. */
			for (j = 0; j < node->nchildren; j++) {
				const ctl_named_node_t *child =
				    ctl_named_children(node, j);
				if (strlen(child->name) == elen &&
				    strncmp(elm, child->name, elen) == 0) {
					node = child;
					mibp[i] = j;
					break;
				}
			}
			if (node == pnode) {
				ret = ENOENT;
				goto label_return;
			}
		} else {
			uintmax_t index;
			const ctl_indexed_node_t *inode;

			/* Children are indexed. */
			index = malloc_strtoumax(elm, NULL, 10);
			if (index == UINTMAX_MAX || index > SIZE_T_MAX) {
				ret = ENOENT;
				goto label_return;
			}

			inode = ctl_indexed_node(node->children);
			node = inode->index(tsdn, mibp, *depthp, (size_t)index);
			if (node == NULL) {
				ret = ENOENT;
				goto label_return;
			}

			mibp[i] = (size_t)index;
		}

		/* Reached the end? */
		if (node->ctl != NULL || *dot == '\0') {
			/* Terminal node. */
			if (*dot != '\0') {
				/*
				 * The name contains more elements than are
				 * in this path through the tree.
				 */
				ret = ENOENT;
				goto label_return;
			}
			/* Complete lookup successful. */
			*depthp = i + 1;
			break;
		}

		/* Update elm. */
		elm = &dot[1];
		dot = ((tdot = strchr(elm, '.')) != NULL) ? tdot :
		    strchr(elm, '\0');
		elen = (size_t)((uintptr_t)dot - (uintptr_t)elm);
	}
	if (ending_nodep != NULL) {
		*ending_nodep = node;
	}

	ret = 0;
label_return:
	return ret;
}